

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebugIfHasDebugStreamContainer<QMap<QString,_QVariant>,_QString,_QVariant>
operator<<(QDebug debug,QMap<QString,_QVariant> *map)

{
  QMap<QString,_QVariant> *in_RDX;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
        )(map->d).d.ptr;
  (map->d).d.ptr =
       (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
        *)0x0;
  QtPrivate::printAssociativeContainer<QMap<QString,QVariant>>
            ((QtPrivate *)debug.stream,(Stream *)&local_18,"QMap",in_RDX);
  QDebug::~QDebug((QDebug *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (QDebugIfHasDebugStreamContainer<QMap<QString,_QVariant>,_QString,_QVariant>)debug.stream
    ;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebugIfHasDebugStreamContainer<QMap<Key, T>, Key, T> operator<<(QDebug debug, const QMap<Key, T> &map)
{
    return QtPrivate::printAssociativeContainer(std::move(debug), "QMap", map);
}